

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O1

void * fe_load_effect(fe_state *s,fe_effect *effect)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int pin;
  char *pcVar4;
  fe_node **ppfVar5;
  fe_node *pfVar6;
  fe_node *dest;
  int i;
  int iVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  float fVar13;
  
  effect->text[0] = '\0';
  effect->path_back[0] = '\0';
  effect->path_font[0] = '\0';
  effect->distance = 1.0;
  effect->px = -999;
  effect->py = -999;
  pcVar4 = s->data;
  s->token = pcVar4;
  iVar7 = s->size;
  pcVar9 = "#";
  do {
    if (*pcVar9 == '\0') break;
    if ((iVar7 < 1) || (*pcVar4 != *pcVar9)) {
      s->error = true;
      bVar2 = false;
    }
    else {
      pcVar4 = pcVar4 + 1;
      s->data = pcVar4;
      iVar7 = iVar7 + -1;
      s->size = iVar7;
      pcVar9 = pcVar9 + 1;
      bVar2 = true;
    }
  } while (bVar2);
  if ((s->error != true) && (read_token(s), s->error != true)) {
    pcVar4 = s->token;
    lVar8 = 0;
    do {
      effect->id[lVar8] = pcVar4[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x20);
    pcVar4 = s->data;
    s->token = pcVar4;
    iVar7 = s->size;
    pcVar9 = "size:";
    do {
      if (*pcVar9 == '\0') break;
      if ((iVar7 < 1) || (*pcVar4 != *pcVar9)) {
        s->error = true;
        bVar2 = false;
      }
      else {
        pcVar4 = pcVar4 + 1;
        s->data = pcVar4;
        iVar7 = iVar7 + -1;
        s->size = iVar7;
        pcVar9 = pcVar9 + 1;
        bVar2 = true;
      }
    } while (bVar2);
    if (s->error != true) {
      read_token(s);
      iVar7 = atoi(s->token);
      effect->size = iVar7;
      if (s->error == false) {
        pcVar4 = s->data;
        cVar1 = *pcVar4;
        while (cVar1 != '@') {
          read_token(s);
          if (s->error == true) goto LAB_001109fa;
          pcVar4 = s->token;
          iVar7 = strcmp(pcVar4,"distance");
          if (iVar7 == 0) {
            fVar13 = read_float(s);
            effect->distance = fVar13;
LAB_001107b5:
            if (s->error == true) goto LAB_001109fa;
          }
          else {
            iVar7 = strcmp(pcVar4,"pos");
            if (iVar7 == 0) {
              read_token(s);
              iVar7 = atoi(s->token);
              effect->px = (short)iVar7;
              if (s->error != true) {
                read_token(s);
                iVar7 = atoi(s->token);
                effect->py = (short)iVar7;
                goto LAB_001107b5;
              }
              goto LAB_001109fa;
            }
            iVar7 = strcmp(pcVar4,"font");
            pcVar9 = (char *)0x0;
            if (iVar7 == 0) {
              pcVar9 = effect->path_font;
            }
            iVar3 = strcmp(pcVar4,"back");
            if (iVar3 == 0) {
              pcVar9 = effect->path_back;
            }
            lVar8 = (ulong)(iVar3 == 0 || iVar7 == 0) << 8;
            iVar7 = strcmp(pcVar4,"text");
            if (iVar7 == 0) {
              lVar8 = 0x20;
              pcVar9 = effect->text;
            }
            s->token = s->data;
            do {
              if (s->size < 1) goto LAB_00110737;
              pcVar4 = s->data;
              cVar1 = *pcVar4;
              iVar7 = 3;
              if ((cVar1 != '\0') && (cVar1 != '\n')) {
                if (cVar1 == '\r') {
                  *pcVar4 = '\0';
                  if (s->size < 1) {
                    s->error = true;
                    iVar7 = 1;
                  }
                  else {
                    s->data = s->data + 1;
                    s->size = s->size + -1;
                  }
                }
                else {
                  s->data = pcVar4 + 1;
                  s->size = s->size + -1;
                  iVar7 = 0;
                }
              }
            } while (iVar7 == 0);
            if (iVar7 != 1) {
              *s->data = '\0';
              s->data = s->data + 1;
              s->size = s->size + -1;
            }
LAB_00110737:
            if (s->error == true) goto LAB_001109fa;
            if ((int)lVar8 != 0) {
              pcVar4 = s->token;
              lVar10 = 0;
              do {
                pcVar9[lVar10] = pcVar4[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar8 != lVar10);
            }
          }
          pcVar4 = s->data;
          cVar1 = *pcVar4;
        }
        s->token = pcVar4;
        iVar7 = s->size;
        pcVar9 = "@nodes";
        do {
          if (*pcVar9 == '\0') break;
          if ((iVar7 < 1) || (*pcVar4 != *pcVar9)) {
            s->error = true;
            bVar2 = false;
          }
          else {
            pcVar4 = pcVar4 + 1;
            s->data = pcVar4;
            iVar7 = iVar7 + -1;
            s->size = iVar7;
            pcVar9 = pcVar9 + 1;
            bVar2 = true;
          }
        } while (bVar2);
        if ((s->error != true) && (next_line(s), s->error != true)) {
          if (s->size < 1) {
            uVar11 = 0;
          }
          else {
            lVar8 = 0;
            uVar11 = 0;
            do {
              uVar11 = (s->data[lVar8] == '*') + uVar11;
              if (s->data[lVar8] == '@') break;
              lVar8 = lVar8 + 1;
            } while ((int)lVar8 < s->size);
          }
          effect->num = uVar11;
          ppfVar5 = (fe_node **)_fe_alloc((long)(int)uVar11 * 8);
          effect->nodes = ppfVar5;
          if (0 < (int)uVar11) {
            uVar12 = 0;
            do {
              pfVar6 = fe_load_node(s);
              pfVar6->effect = effect;
              pfVar6->index = (int)uVar12;
              effect->nodes[uVar12] = pfVar6;
              if (s->error == true) goto LAB_001109fa;
              if (pfVar6->type == 0x32) {
                effect->out_node = pfVar6;
              }
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
          }
          pcVar4 = s->data;
          s->token = pcVar4;
          iVar7 = s->size;
          pcVar9 = "@edges";
          do {
            if (*pcVar9 == '\0') break;
            if ((iVar7 < 1) || (*pcVar4 != *pcVar9)) {
              s->error = true;
              bVar2 = false;
            }
            else {
              pcVar4 = pcVar4 + 1;
              s->data = pcVar4;
              iVar7 = iVar7 + -1;
              s->size = iVar7;
              pcVar9 = pcVar9 + 1;
              bVar2 = true;
            }
          } while (bVar2);
          if ((s->error == false) && (next_line(s), s->error != true)) {
            pcVar4 = s->data;
            if (*pcVar4 == '*') {
              pfVar6 = *effect->nodes;
              dest = pfVar6;
              do {
                s->data = pcVar4 + 1;
                s->size = s->size + -1;
                read_token(s);
                if (s->error == true) goto LAB_001109fa;
                iVar7 = atoi(s->token);
                read_token(s);
                if (s->error == true) goto LAB_001109fa;
                iVar3 = atoi(s->token);
                read_token(s);
                if (s->error == true) goto LAB_001109fa;
                pin = atoi(s->token);
                if (pfVar6->id != iVar7) {
                  pfVar6 = fe_effect_find_node(effect,iVar7);
                }
                if (dest->id != iVar3) {
                  dest = fe_effect_find_node(effect,iVar3);
                }
                _fe_node_connect(pfVar6,dest,pin);
                pcVar4 = s->data;
              } while (*pcVar4 == '*');
            }
            return (void *)0x0;
          }
        }
      }
    }
  }
LAB_001109fa:
  __assert_fail("!\"fe parse error\"",
                "/workspace/llm4binary/github/license_c_cmakelists/frankinshtein[P]font-effects-lib/src/fe_bundle.cpp"
                ,0x2c,"void error()");
}

Assistant:

void* fe_load_effect(fe_state& s, fe_effect* effect)
{
    effect->text[0] = 0;
    effect->path_back[0] = 0;
    effect->path_font[0] = 0;
    effect->distance = 1.0f;
	effect->px = -999;
	effect->py = -999;

    read_fixed(s, "#");
    CHECK_ERR();

    read_token(s);
    CHECK_ERR();
    safe_strcpy(effect->id, s.token);

    read_fixed(s, "size:");
    CHECK_ERR();

    effect->size = READ_INT(s);


    while (s.data[0] != '@')
    {
        read_token(s);
        CHECK_ERR();

        if (!strcmp(s.token, "distance"))
        {
            effect->distance = READ_FLOAT(s);
            continue;
        }


		if (!strcmp(s.token, "pos"))
		{
			effect->px = READ_INT(s);
			effect->py = READ_INT(s);
			continue;
		}

        char *param = 0;
        int len = 0;
        if (!strcmp(s.token, "font"))
        {
            len = sizeof(effect->path_font);
            param = effect->path_font;
        }
        if (!strcmp(s.token, "back"))
        {
            len = sizeof(effect->path_back);
            param = effect->path_back;
        }
        if (!strcmp(s.token, "text"))
        {
            len = sizeof(effect->text);
            param = effect->text;
        }

        

        read_token_end_line(s);
        CHECK_ERR();
        safe_strcpy(param, len, s.token);
    }
    
    read_fixed(s, "@nodes");
    CHECK_ERR();

    next_line(s);
    CHECK_ERR();

    int num = 0;
    const char* p = s.data;
    for (int i = 0; i < s.size; ++i)
    {
        if (*p == '*')
            num++;
        if (*p == '@')
            break;
        ++p;
    }

    effect->num = num;
    effect->nodes = (fe_node**)_fe_alloc(sizeof(fe_node*) * num);

    for (int i = 0; i < num; ++i)
    {
        fe_node *node = fe_load_node(s);
        node->effect = effect;
        node->index = i;

        effect->nodes[i] = node;
        CHECK_ERR();      


        if (node->type == fe_node_type_out)
            effect->out_node = node;
    }

    read_fixed(s, "@edges");
    CHECK_ERR();

    next_line(s);
    CHECK_ERR();


    num = 0;
    p = s.data;
    for (int i = 0; i < s.size; ++i)
    {
        if (*p == '*')
            num++;
        if (*p == '#')
            break;
        ++p;
    }


    fe_node* srcLast = effect->nodes[0];
    fe_node* destLast = effect->nodes[0];
    while (*s.data == '*')
    {
        s.data++;
        s.size--;

        read_token(s);
        CHECK_ERR();

        int sn = atoi(s.token);

        read_token(s);
        CHECK_ERR();

        int dn = atoi(s.token);

        read_token(s);
        CHECK_ERR();

        int dp = atoi(s.token);

        if (srcLast->id != sn)
            srcLast = fe_effect_find_node(effect, sn);

        if (destLast->id != dn)
            destLast = fe_effect_find_node(effect, dn);

        _fe_node_connect(srcLast, destLast, dp);
    }



    return 0;
}